

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satcheck.c
# Opt level: O0

parasail_result_t *
parasail_sg_db_stats_rowcol_diag_sse2_128_sat
          (char *s1,int s1Len,char *s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int iVar1;
  undefined8 local_38;
  parasail_result_t *result;
  int gap_local;
  int open_local;
  int s2Len_local;
  char *s2_local;
  int s1Len_local;
  char *s1_local;
  
  local_38 = parasail_sg_db_stats_rowcol_diag_sse2_128_8(s1,s1Len,s2,s2Len,open,gap,matrix);
  iVar1 = parasail_result_is_saturated(local_38);
  if (iVar1 != 0) {
    parasail_result_free(local_38);
    local_38 = parasail_sg_db_stats_rowcol_diag_sse2_128_16(s1,s1Len,s2,s2Len,open,gap,matrix);
  }
  iVar1 = parasail_result_is_saturated(local_38);
  if (iVar1 != 0) {
    parasail_result_free(local_38);
    local_38 = parasail_sg_db_stats_rowcol_diag_sse2_128_32(s1,s1Len,s2,s2Len,open,gap,matrix);
  }
  return local_38;
}

Assistant:

parasail_result_t* parasail_sg_db_stats_rowcol_diag_sse2_128_sat(
        const char * const restrict s1, const int s1Len,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        const parasail_matrix_t *matrix)
{
    parasail_result_t * result = NULL;

    result = parasail_sg_db_stats_rowcol_diag_sse2_128_8(s1, s1Len, s2, s2Len, open, gap, matrix);
    if (parasail_result_is_saturated(result)) {
        parasail_result_free(result);
        result = parasail_sg_db_stats_rowcol_diag_sse2_128_16(s1, s1Len, s2, s2Len, open, gap, matrix);
    }
    if (parasail_result_is_saturated(result)) {
        parasail_result_free(result);
        result = parasail_sg_db_stats_rowcol_diag_sse2_128_32(s1, s1Len, s2, s2Len, open, gap, matrix);
    }

    return result;
}